

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPF.cpp
# Opt level: O2

void __thiscall
OpenMD::RNEMD::SPFMethod::isValidExchange
          (SPFMethod *this,Vector3d *v_a,Vector3d *v_b,RealType *a,RealType *b)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  RealType RVar3;
  double dVar4;
  undefined4 extraout_EAX;
  int iVar5;
  SPFMethod *this_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar7;
  undefined1 auVar6 [16];
  double dVar8;
  undefined8 local_e8;
  undefined8 local_c8;
  SlabThermodynamics local_a8;
  SlabThermodynamics local_80;
  undefined1 local_58 [16];
  Vector<double,_3U> local_48;
  
  this_00 = (SPFMethod *)v_a;
  calculateSlabTherodynamicQuantities(&local_80,(SPFMethod *)v_a,&this->smanA_);
  calculateSlabTherodynamicQuantities(&local_a8,this_00,&this->smanB_);
  RVar3 = SPFForceManager::getScaledDeltaU(this->forceManager_);
  if ((0.0 < local_80.M) && (0.0 < (double)CONCAT44(local_a8.M._4_4_,local_a8.M._0_4_))) {
    dVar8 = RVar3 * 0.0004184;
    operator/(&local_48,(Vector<double,_3U> *)&local_80,local_80.M);
    Vector3<double>::operator=(v_a,&local_48);
    operator/(&local_48,(Vector<double,_3U> *)&local_a8,
              (double)CONCAT44(local_a8.M._4_4_,local_a8.M._0_4_));
    Vector3<double>::operator=(v_b,&local_48);
    if (this->uniformKineticScaling_ == true) {
      dVar7 = Vector<double,_3U>::lengthSquare(&v_a->super_Vector<double,_3U>);
      dVar4 = Vector<double,_3U>::lengthSquare(&v_b->super_Vector<double,_3U>);
      dVar8 = dVar8 / (dVar4 * (double)CONCAT44(local_a8.M._4_4_,local_a8.M._0_4_) * -0.5 +
                      dVar7 * local_80.M * -0.5 +
                      local_80.K + (double)CONCAT44(local_a8.K._4_4_,local_a8.K._0_4_)) + 1.0;
      if (dVar8 <= 0.0) {
        return;
      }
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        dVar8 = SQRT(dVar8);
      }
      *a = dVar8;
    }
    else {
      local_58._8_4_ = extraout_XMM0_Dc;
      local_58._0_8_ = dVar8 - (this->super_RNEMD).kineticTarget_;
      local_58._12_4_ = extraout_XMM0_Dd;
      dVar7 = Vector<double,_3U>::lengthSquare(&v_a->super_Vector<double,_3U>);
      auVar6._8_4_ = local_58._0_4_;
      auVar6._0_8_ = dVar8 + (this->super_RNEMD).kineticTarget_;
      auVar6._12_4_ = local_58._4_4_;
      local_c8 = (double)CONCAT44(local_a8.M._4_4_,local_a8.M._0_4_);
      local_e8 = (double)CONCAT44(local_a8.K._4_4_,local_a8.K._0_4_);
      dVar8 = Vector<double,_3U>::lengthSquare(&v_b->super_Vector<double,_3U>);
      dVar7 = (local_80.K + local_80.K) - dVar7 * local_80.M;
      auVar1._8_4_ = SUB84(dVar7,0);
      auVar1._0_8_ = (local_e8 + local_e8) - dVar8 * local_c8;
      auVar1._12_4_ = (int)((ulong)dVar7 >> 0x20);
      auVar6 = divpd(auVar6,auVar1);
      dVar8 = auVar6._0_8_ + 1.0;
      dVar7 = auVar6._8_8_ + 1.0;
      auVar2._8_4_ = (int)-(ulong)(0.0 < dVar7);
      auVar2._0_8_ = -(ulong)(0.0 < dVar8);
      auVar2._12_4_ = (int)(-(ulong)(0.0 < dVar7) >> 0x20);
      iVar5 = movmskpd(extraout_EAX,auVar2);
      if (iVar5 != 3) {
        return;
      }
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      *a = dVar7;
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        dVar8 = SQRT(dVar8);
      }
    }
    *b = dVar8;
  }
  return;
}

Assistant:

void SPFMethod::isValidExchange(Vector3d& v_a, Vector3d& v_b, RealType& a,
                                  RealType& b) {
    const auto& [P_a, M_a, K_a] = calculateSlabTherodynamicQuantities(smanA_);
    const auto& [P_b, M_b, K_b] = calculateSlabTherodynamicQuantities(smanB_);

    RealType deltaU =
        Constants::energyConvert * forceManager_->getScaledDeltaU();

    if ((M_a > 0.0) && (M_b > 0.0)) {  // both slabs are not empty
      v_a = P_a / M_a;
      v_b = P_b / M_b;

      if (uniformKineticScaling_) {
        RealType numerator   = deltaU;
        RealType denominator = K_a + K_b;
        denominator -= 0.5 * M_a * v_a.lengthSquare();
        denominator -= 0.5 * M_b * v_b.lengthSquare();

        RealType a2 = (numerator / denominator) + 1.0;

        if (a2 > 0.0) {
          a = std::sqrt(a2);
          b = a;
        }
      } else {
        RealType aNumerator   = deltaU - kineticTarget_;
        RealType aDenominator = 2.0 * K_a;
        aDenominator -= M_a * v_a.lengthSquare();

        RealType bNumerator   = deltaU + kineticTarget_;
        RealType bDenominator = 2.0 * K_b;
        bDenominator -= M_b * v_b.lengthSquare();

        RealType a2 = (aNumerator / aDenominator) + 1.0;
        RealType b2 = (bNumerator / bDenominator) + 1.0;

        if (a2 > 0.0 && b2 > 0.0) {
          a = std::sqrt(a2);
          b = std::sqrt(b2);
        }
      }
    }
  }